

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O1

void (anonymous_namespace)::print<Imf_2_5::MultiViewChannelName*>
               (MultiViewChannelName **begin,MultiViewChannelName **end)

{
  MultiViewChannelName *pMVar1;
  ostream *poVar2;
  int p;
  int iVar3;
  char local_3f [3];
  int local_3c;
  MultiViewChannelName **local_38;
  
  local_3c = 1;
  for (pMVar1 = *begin; pMVar1 != *end; pMVar1 = pMVar1 + 1) {
    if (local_3c < pMVar1->part_number) {
      local_3c = pMVar1->part_number;
    }
  }
  iVar3 = 0;
  local_38 = begin;
  do {
    for (pMVar1 = *local_38; pMVar1 != *end; pMVar1 = pMVar1 + 1) {
      if (pMVar1->part_number == iVar3) {
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,pMVar1->part_number);
        local_3f[0] = ' ';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3f,1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(pMVar1->name)._M_dataplus._M_p,(pMVar1->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," in ",4);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(pMVar1->view)._M_dataplus._M_p,(pMVar1->view)._M_string_length);
        local_3f[1] = 0x20;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3f + 1,1);
        local_3f[2] = 0x20;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3f + 2,1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(pMVar1->internal_name)._M_dataplus._M_p,
                            (pMVar1->internal_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != local_3c);
  return;
}

Assistant:

void
print(const T & begin,const T & end)
{
    int parts=1;
    for(T i=begin;i!=end;i++)
    {
        parts=max(i->part_number,parts);
    }

    for(int p=0;p<parts;p++)
    {
        for(T i=begin;i!=end;i++)
        {
            if(i->part_number==p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}